

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

void ecc_edwards_curve_free(EdwardsCurve *ec)

{
  EdwardsCurve *ec_local;
  
  mp_free(ec->p);
  mp_free(ec->d);
  mp_free(ec->a);
  monty_free(ec->mc);
  if (ec->sc != (ModsqrtContext *)0x0) {
    modsqrt_free(ec->sc);
  }
  safefree(ec);
  return;
}

Assistant:

void ecc_edwards_curve_free(EdwardsCurve *ec)
{
    mp_free(ec->p);
    mp_free(ec->d);
    mp_free(ec->a);
    monty_free(ec->mc);
    if (ec->sc)
        modsqrt_free(ec->sc);
    sfree(ec);
}